

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O1

void __thiscall
QDialogButtonBox::addButton(QDialogButtonBox *this,QAbstractButton *button,ButtonRole role)

{
  QDialogButtonBoxPrivate *this_00;
  QDialogButtonBoxPrivate *d;
  
  if ((uint)role < 9) {
    this_00 = *(QDialogButtonBoxPrivate **)(this + 8);
    QDialogButtonBoxPrivate::removeButton(this_00,button,ManualRemove);
    QWidget::setParent(&button->super_QWidget,(QWidget *)this);
    QDialogButtonBoxPrivate::addButton(this_00,button,role,DoLayout,Connect);
    return;
  }
  addButton();
  return;
}

Assistant:

void QDialogButtonBox::addButton(QAbstractButton *button, ButtonRole role)
{
    Q_D(QDialogButtonBox);
    if (Q_UNLIKELY(role <= InvalidRole || role >= NRoles)) {
        qWarning("QDialogButtonBox::addButton: Invalid ButtonRole, button not added");
        return;
    }
    removeButton(button);
    button->setParent(this);
    d->addButton(button, role);
}